

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

size_t __thiscall SoftHSM::RFC5652Pad(SoftHSM *this,ByteString *keydata,size_t blocksize)

{
  size_t sVar1;
  uchar *__s;
  size_t __n;
  
  sVar1 = ByteString::size(keydata);
  __n = blocksize - sVar1 % blocksize;
  ByteString::resize(keydata,__n + sVar1);
  __s = ByteString::operator[](keydata,sVar1);
  memset(__s,(int)__n,__n);
  sVar1 = ByteString::size(keydata);
  return sVar1;
}

Assistant:

size_t SoftHSM::RFC5652Pad(ByteString &keydata, size_t blocksize)
{
	size_t wrappedlen = keydata.size();
	auto padbytes = blocksize - (wrappedlen % blocksize);
	if(padbytes == 0)
		padbytes += blocksize;

	keydata.resize(wrappedlen + padbytes);
	memset(&keydata[wrappedlen], static_cast<char>(padbytes), padbytes);
	return keydata.size();
}